

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Scope::~Scope(Scope *this)

{
  void *pvVar1;
  void *pvVar2;
  _Rb_tree_node_base *p_Var3;
  ElementMap *__range2;
  
  for (p_Var3 = (this->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->elements)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pvVar1 = *(void **)(p_Var3 + 2);
    if (pvVar1 != (void *)0x0) {
      std::unique_ptr<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>::~unique_ptr
                ((unique_ptr<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_> *)
                 ((long)pvVar1 + 0x20));
      pvVar2 = *(void **)((long)pvVar1 + 8);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x18) - (long)pvVar2);
      }
    }
    operator_delete(pvVar1,0x28);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
               *)this);
  return;
}

Assistant:

Scope::~Scope()
{
    for(ElementMap::value_type& v : elements) {
        delete v.second;
    }
}